

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SNMPParser.cpp
# Opt level: O0

SNMP_ERROR_RESPONSE
handlePacket(uint8_t *buffer,int packetLength,int *responseLength,int max_packet_size,
            deque<ValueCallback_*,_std::allocator<ValueCallback_*>_> *callbacks,string *_community,
            string *_readOnlyCommunity,informCB informCallback,void *ctx)

{
  bool bVar1;
  SNMP_PACKET_PARSE_ERROR SVar2;
  SNMP_PERMISSION SVar3;
  int iVar4;
  reference response_00;
  VarBind *item;
  iterator __end2;
  iterator __begin2;
  deque<VarBind,_std::allocator<VarBind>_> *__range2;
  SNMP_ERROR_RESPONSE local_268;
  SNMP_ERROR_STATUS globalError;
  SNMP_ERROR_RESPONSE handleStatus;
  bool pass;
  deque<VarBind,_std::allocator<VarBind>_> outResponseList;
  SNMPResponse response;
  SNMP_PERMISSION requestPermission;
  undefined1 local_118 [4];
  SNMP_PACKET_PARSE_ERROR parseResult;
  SNMPPacket request;
  string *_community_local;
  deque<ValueCallback_*,_std::allocator<ValueCallback_*>_> *callbacks_local;
  int max_packet_size_local;
  int *responseLength_local;
  int packetLength_local;
  uint8_t *buffer_local;
  
  request.packet = (ComplexType *)_community;
  SNMPPacket::SNMPPacket((SNMPPacket *)local_118);
  SVar2 = SNMPPacket::parseFrom((SNMPPacket *)local_118,buffer,(long)packetLength);
  if (SVar2 < 1) {
    buffer_local._4_4_ = SNMP_REQUEST_INVALID;
  }
  else if (request._104_4_ == 0xa2) {
    if (informCallback != (informCB)0x0) {
      (*informCallback)(ctx,(snmp_request_id_t)
                            request.communityStringPtr.
                            super___shared_ptr<OctetType,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                            _M_pi,
                        (uint)request.varbindList.
                              super__Deque_base<VarBind,_std::allocator<VarBind>_>._M_impl.
                              super__Deque_impl_data._M_finish._M_node == 0);
    }
    buffer_local._4_4_ = SNMP_INFORM_RESPONSE_OCCURRED;
  }
  else {
    SVar3 = getPermissionOfRequest
                      ((SNMPPacket *)local_118,(string *)request.packet,_readOnlyCommunity);
    if (SVar3 == SNMP_PERM_NONE) {
      buffer_local._4_4_ = SNMP_REQUEST_INVALID_COMMUNITY;
    }
    else {
      SNMPResponse::SNMPResponse
                ((SNMPResponse *)
                 &outResponseList.super__Deque_base<VarBind,_std::allocator<VarBind>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_node,(SNMPPacket *)local_118);
      Catch::clara::std::deque<VarBind,_std::allocator<VarBind>_>::deque
                ((deque<VarBind,_std::allocator<VarBind>_> *)&handleStatus);
      local_268 = SNMP_NO_ERROR;
      __range2._4_4_ = GEN_ERR;
      if (request._104_4_ - 0xa0 < 2) {
        globalError._3_1_ =
             handleGetRequestPDU(callbacks,
                                 (deque<VarBind,_std::allocator<VarBind>_> *)&request.packetPDUType,
                                 (deque<VarBind,_std::allocator<VarBind>_> *)&handleStatus,
                                 (SNMP_VERSION)request.requestID,request._104_4_ == 0xa1);
        local_268 = SNMP_GETNEXT_OCCURRED;
        if (request._104_4_ == 0xa0) {
          local_268 = SNMP_GET_OCCURRED;
        }
      }
      else if (request._104_4_ == 0xa3) {
        if (SVar3 == SNMP_PERM_READ_WRITE) {
          globalError._3_1_ =
               handleSetRequestPDU(callbacks,
                                   (deque<VarBind,_std::allocator<VarBind>_> *)
                                   &request.packetPDUType,
                                   (deque<VarBind,_std::allocator<VarBind>_> *)&handleStatus,
                                   (SNMP_VERSION)request.requestID);
          local_268 = SNMP_SET_OCCURRED;
        }
        else {
          globalError._3_1_ = NO_ERROR >> 0x18;
          __range2._4_4_ = NO_ACCESS;
        }
      }
      else if (request._104_4_ == 0xa5) {
        if ((SNMP_VERSION)request.requestID == SNMP_VERSION_2C) {
          globalError._3_1_ =
               handleGetBulkRequestPDU
                         (callbacks,
                          (deque<VarBind,_std::allocator<VarBind>_> *)&request.packetPDUType,
                          (deque<VarBind,_std::allocator<VarBind>_> *)&handleStatus,
                          (uint)request.varbindList.
                                super__Deque_base<VarBind,_std::allocator<VarBind>_>._M_impl.
                                super__Deque_impl_data._M_finish._M_node,
                          request.varbindList.super__Deque_base<VarBind,_std::allocator<VarBind>_>.
                          _M_impl.super__Deque_impl_data._M_finish._M_node._4_4_);
          local_268 = SNMP_GETBULK_OCCURRED;
        }
        else {
          globalError._3_1_ = NO_ERROR >> 0x18;
        }
        __range2._4_4_ = GEN_ERR;
      }
      else {
        local_268 = SNMP_UNKNOWN_PDU_OCCURRED;
        globalError._3_1_ = NO_ERROR >> 0x18;
      }
      if (globalError._3_1_ == NO_ERROR >> 0x18) {
        SNMPResponse::setGlobalError
                  ((SNMPResponse *)
                   &outResponseList.super__Deque_base<VarBind,_std::allocator<VarBind>_>._M_impl.
                    super__Deque_impl_data._M_finish._M_node,__range2._4_4_,0,1);
        local_268 = SNMP_ERROR_PACKET_SENT;
      }
      else {
        std::deque<VarBind,_std::allocator<VarBind>_>::begin
                  ((iterator *)&__end2._M_node,
                   (deque<VarBind,_std::allocator<VarBind>_> *)&handleStatus);
        std::deque<VarBind,_std::allocator<VarBind>_>::end
                  ((iterator *)&item,(deque<VarBind,_std::allocator<VarBind>_> *)&handleStatus);
        while (bVar1 = std::operator!=((_Self *)&__end2._M_node,(_Self *)&item), bVar1) {
          response_00 = Catch::clara::std::_Deque_iterator<VarBind,_VarBind_&,_VarBind_*>::operator*
                                  ((_Deque_iterator<VarBind,_VarBind_&,_VarBind_*> *)&__end2._M_node
                                  );
          if (response_00->errorStatus == NO_ERROR) {
            SNMPResponse::addResponse
                      ((SNMPResponse *)
                       &outResponseList.super__Deque_base<VarBind,_std::allocator<VarBind>_>._M_impl
                        .super__Deque_impl_data._M_finish._M_node,response_00);
          }
          else {
            SNMPResponse::addErrorResponse
                      ((SNMPResponse *)
                       &outResponseList.super__Deque_base<VarBind,_std::allocator<VarBind>_>._M_impl
                        .super__Deque_impl_data._M_finish._M_node,response_00);
          }
          std::_Deque_iterator<VarBind,_VarBind_&,_VarBind_*>::operator++
                    ((_Deque_iterator<VarBind,_VarBind_&,_VarBind_*> *)&__end2._M_node);
        }
      }
      memset(buffer,0,(long)max_packet_size);
      iVar4 = SNMPPacket::serialiseInto
                        ((SNMPPacket *)
                         &outResponseList.super__Deque_base<VarBind,_std::allocator<VarBind>_>.
                          _M_impl.super__Deque_impl_data._M_finish._M_node,buffer,
                         (long)max_packet_size);
      *responseLength = iVar4;
      if (*responseLength < 1) {
        buffer_local._4_4_ = SNMP_FAILED_SERIALISATION;
      }
      else {
        buffer_local._4_4_ = local_268;
      }
      std::deque<VarBind,_std::allocator<VarBind>_>::~deque
                ((deque<VarBind,_std::allocator<VarBind>_> *)&handleStatus);
      SNMPResponse::~SNMPResponse
                ((SNMPResponse *)
                 &outResponseList.super__Deque_base<VarBind,_std::allocator<VarBind>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_node);
    }
  }
  SNMPPacket::~SNMPPacket((SNMPPacket *)local_118);
  return buffer_local._4_4_;
}

Assistant:

SNMP_ERROR_RESPONSE handlePacket(uint8_t* buffer, int packetLength, int* responseLength, int max_packet_size, std::deque<ValueCallback*> &callbacks, const std::string& _community, const std::string& _readOnlyCommunity, informCB informCallback, void* ctx){
    SNMPPacket request;

    SNMP_PACKET_PARSE_ERROR parseResult = request.parseFrom(buffer, packetLength);
    if(parseResult <= 0){
        SNMP_LOGW("Received Error code: %d when attempting to parse\n", parseResult);
        return SNMP_REQUEST_INVALID;
    }

    SNMP_LOGD("Valid SNMP Packet!");

    if(request.packetPDUType == GetResponsePDU){
        SNMP_LOGD("Received GetResponse! probably as a result of a recent InformTrap: %lu", request.requestID);
        if(informCallback){
            informCallback(ctx, request.requestID, !request.errorStatus.errorStatus);
        } else {
            SNMP_LOGW("Not sure what to do with Inform\n");
        }
        return SNMP_INFORM_RESPONSE_OCCURRED;
    }

    SNMP_PERMISSION requestPermission = getPermissionOfRequest(request, _community, _readOnlyCommunity);
    if(requestPermission == SNMP_PERM_NONE){
        SNMP_LOGW("Invalid communitystring provided: %s, no response to give\n", request.communityString.c_str());
        return SNMP_REQUEST_INVALID_COMMUNITY;
    }
    
    // this will take the required stuff from request - like requestID and community string etc
    SNMPResponse response = SNMPResponse(request);

    std::deque<VarBind> outResponseList;

    bool pass = false;
    SNMP_ERROR_RESPONSE handleStatus = SNMP_NO_ERROR;
    SNMP_ERROR_STATUS globalError = GEN_ERR;

    switch(request.packetPDUType){
        case GetRequestPDU:
        case GetNextRequestPDU:
            pass = handleGetRequestPDU(callbacks, request.varbindList, outResponseList, request.snmpVersion, request.packetPDUType == GetNextRequestPDU);
            handleStatus = request.packetPDUType == GetRequestPDU ? SNMP_GET_OCCURRED : SNMP_GETNEXT_OCCURRED;
        break;
        case GetBulkRequestPDU:
            if(request.snmpVersion != SNMP_VERSION_2C){
                SNMP_LOGD("Received GetBulkRequest in SNMP_VERSION_1");
                pass = false;
                globalError = GEN_ERR;
            } else {
                pass = handleGetBulkRequestPDU(callbacks, request.varbindList, outResponseList, request.errorStatus.nonRepeaters, request.errorIndex.maxRepititions);
                handleStatus = SNMP_GETBULK_OCCURRED;
            }
        break;
        case SetRequestPDU:
            if(requestPermission != SNMP_PERM_READ_WRITE){
                SNMP_LOGD("Attempting to perform a SET without required permissions");
                pass = false;
                globalError = NO_ACCESS;
            } else {
                pass = handleSetRequestPDU(callbacks, request.varbindList, outResponseList, request.snmpVersion);
                handleStatus = SNMP_SET_OCCURRED;
            }
        break;
        default:
            SNMP_LOGD("Not sure what to do with SNMP PDU of type: %d\n", request.packetPDUType);
            handleStatus = SNMP_UNKNOWN_PDU_OCCURRED;
            pass = false;
        break;
    }

    if(pass){
        for(const auto& item : outResponseList){
            if(item.errorStatus != NO_ERROR){
                response.addErrorResponse(item);
            } else {
                response.addResponse(item);
            }
        }
    } else {
        // Something went wrong, generic error response
        SNMP_LOGD("Handled error when building request, error: %d, sending error PDU", globalError);
        response.setGlobalError(globalError, 0, true);
        handleStatus = SNMP_ERROR_PACKET_SENT;
    }

    memset(buffer, 0, max_packet_size);

    *responseLength = response.serialiseInto(buffer, max_packet_size);
    if(*responseLength <= 0){
        SNMP_LOGD("Failed to build response packet");
        return SNMP_FAILED_SERIALISATION;
    }

    return handleStatus;
}